

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testAdaptiveSamplerErrors_Test::
Sampler_testAdaptiveSamplerErrors_Test(Sampler_testAdaptiveSamplerErrors_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00221b50;
  return;
}

Assistant:

TEST(Sampler, testAdaptiveSamplerErrors)
{
    namespace thriftgen = sampling_manager::thrift;

    thriftgen::OperationSamplingStrategy strategy;
    strategy.__set_operation(kTestOperationName);
    thriftgen::ProbabilisticSamplingStrategy probabilisticSampling;
    probabilisticSampling.__set_samplingRate(-0.1);
    strategy.__set_probabilisticSampling(probabilisticSampling);

    thriftgen::PerOperationSamplingStrategies strategies;
    strategies.__set_defaultSamplingProbability(
        kTestDefaultSamplingProbability);
    strategies.__set_defaultLowerBoundTracesPerSecond(2.0);
    strategies.__set_perOperationStrategies({ strategy });

    {
        AdaptiveSampler sampler(strategies, kTestDefaultMaxOperations);
    }

    {
        strategies.perOperationStrategies.at(0)
            .probabilisticSampling.__set_samplingRate(1.1);
        AdaptiveSampler sampler(strategies, kTestDefaultMaxOperations);
    }
}